

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<bool>::Grow
          (RepeatedField<bool> *this,bool was_soo,int old_size,int new_size)

{
  UnpoisonBuffer(this);
  GrowNoAnnotate(this,was_soo,old_size,new_size);
  if (((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
       (undefined1  [16])0x0) && ((this->soo_rep_).field_0.long_rep.capacity != old_size)) {
    internal::LongSooRep::elements((LongSooRep *)this);
    return;
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::Grow(bool was_soo, int old_size,
                                                    int new_size) {
  UnpoisonBuffer();
  GrowNoAnnotate(was_soo, old_size, new_size);
  AnnotateSize(Capacity(), old_size);
}